

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O3

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::EncodeSplitData
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *this)

{
  pointer pTVar1;
  EncoderBuffer *pEVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  
  uVar6 = ((long)(this->topology_split_event_data_).
                 super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->topology_split_event_data_).
                 super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  EncodeVarint<unsigned_int>
            ((uint)uVar6,(this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_);
  if ((uint)uVar6 != 0) {
    lVar3 = (uVar6 & 0xffffffff) * 0xc;
    lVar5 = 0;
    iVar4 = 0;
    do {
      pTVar1 = (this->topology_split_event_data_).
               super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      EncodeVarint<unsigned_int>
                (*(int *)((long)&pTVar1->source_symbol_id + lVar5) - iVar4,
                 (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_);
      EncodeVarint<unsigned_int>
                (*(int *)((long)&pTVar1->source_symbol_id + lVar5) -
                 *(int *)((long)&pTVar1->split_symbol_id + lVar5),
                 (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_);
      iVar4 = *(int *)((long)&pTVar1->source_symbol_id + lVar5);
      lVar5 = lVar5 + 0xc;
    } while (lVar3 != lVar5);
    lVar5 = 0;
    EncoderBuffer::StartBitEncoding
              ((this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_,
               uVar6 & 0xffffffff,false);
    do {
      pEVar2 = (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_;
      if (0 < pEVar2->bit_encoder_reserved_bytes_) {
        EncoderBuffer::BitEncoder::PutBits
                  ((pEVar2->bit_encoder_)._M_t.
                   super___uniq_ptr_impl<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_draco::EncoderBuffer::BitEncoder_*,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
                   .super__Head_base<0UL,_draco::EncoderBuffer::BitEncoder_*,_false>._M_head_impl,
                   (byte)(&((this->topology_split_event_data_).
                            super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0x8)[lVar5] & 1,1);
      }
      lVar5 = lVar5 + 0xc;
    } while (lVar3 != lVar5);
    EncoderBuffer::EndBitEncoding
              ((this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_);
  }
  return true;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::EncodeSplitData() {
  uint32_t num_events =
      static_cast<uint32_t>(topology_split_event_data_.size());
  EncodeVarint(num_events, encoder_->buffer());
  if (num_events > 0) {
    // Encode split symbols using delta and varint coding. Split edges are
    // encoded using direct bit coding.
    int last_source_symbol_id = 0;  // Used for delta coding.
    for (uint32_t i = 0; i < num_events; ++i) {
      const TopologySplitEventData &event_data = topology_split_event_data_[i];
      // Encode source symbol id as delta from the previous source symbol id.
      // Source symbol ids are always stored in increasing order so the delta is
      // going to be positive.
      EncodeVarint<uint32_t>(
          event_data.source_symbol_id - last_source_symbol_id,
          encoder_->buffer());
      // Encode split symbol id as delta from the current source symbol id.
      // Split symbol id is always smaller than source symbol id so the below
      // delta is going to be positive.
      EncodeVarint<uint32_t>(
          event_data.source_symbol_id - event_data.split_symbol_id,
          encoder_->buffer());
      last_source_symbol_id = event_data.source_symbol_id;
    }
    encoder_->buffer()->StartBitEncoding(num_events, false);
    for (uint32_t i = 0; i < num_events; ++i) {
      const TopologySplitEventData &event_data = topology_split_event_data_[i];
      encoder_->buffer()->EncodeLeastSignificantBits32(1,
                                                       event_data.source_edge);
    }
    encoder_->buffer()->EndBitEncoding();
  }
  return true;
}